

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O2

void testMultiTiledPartThreading(string *tempDir)

{
  uint *puVar1;
  Header *pHVar2;
  pointer pTVar3;
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ostream *poVar16;
  long lVar17;
  char *pcVar18;
  ThreadPool *pTVar19;
  WritingTask *pWVar20;
  Box<Imath_3_2::Vec2<int>_> *pBVar21;
  Box<Imath_3_2::Vec2<int>_> *pBVar22;
  float *pfVar23;
  float *pfVar24;
  ChannelList *this;
  ChannelList *pCVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  ReadingTask *pRVar28;
  int iVar29;
  undefined1 *puVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  int i;
  string *psVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  half *phVar40;
  ulong uVar41;
  ulong uVar42;
  int *piVar43;
  long lVar44;
  int startY;
  ulong uVar45;
  stringstream *psVar46;
  float fVar47;
  ulong local_3c0;
  long local_388;
  half local_37a;
  vector<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_> parts;
  MultiPartOutputFile file;
  Header header;
  Array2D<Imath_3_2::half> halfData [2];
  Array2D<unsigned_int> uintData [2];
  Array2D<float> floatData [2];
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  string fn;
  string typeNames [2];
  stringstream ss;
  undefined4 local_1b0 [2];
  long local_1a8 [47];
  
  poVar16 = std::operator<<((ostream *)&std::cout,
                            "Testing the two threads reading/writing on two-tiled-part file");
  std::endl<char,std::char_traits<char>>(poVar16);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar8 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar8);
  iVar8 = 0;
  do {
    if (iVar8 == 3) {
      iVar8 = IlmThread_3_2::ThreadPool::globalThreadPool();
      IlmThread_3_2::ThreadPool::setNumThreads(iVar8);
      poVar16 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar16);
      return;
    }
    for (iVar29 = 0; iVar29 != 3; iVar29 = iVar29 + 1) {
      for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
        uVar15 = 1;
        while( true ) {
          if (0xc4 < uVar15) break;
          (anonymous_namespace)::pixelTypes = iVar8;
          DAT_001d9d14 = iVar29;
          (anonymous_namespace)::levelMode = uVar33;
          (anonymous_namespace)::tileSize = uVar15;
          std::operator+(&fn,tempDir,"imf_test_multi_tiled_part_threading.exr");
          lVar17 = 0x10;
          do {
            puVar30 = (undefined1 *)((long)&typeNames[0]._M_dataplus._M_p + lVar17);
            *(undefined1 **)((long)typeNames + lVar17 + -0x10) = puVar30;
            *(undefined8 *)((long)typeNames + lVar17 + -8) = 0;
            *puVar30 = 0;
            lVar17 = lVar17 + 0x20;
          } while (lVar17 != 0x50);
          local_238 = local_228;
          local_230 = 0;
          local_228[0] = 0;
          psVar35 = typeNames;
          for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 4) {
            if (*(uint *)((long)&(anonymous_namespace)::pixelTypes + lVar17) < 3) {
              std::__cxx11::string::assign((char *)psVar35);
            }
            if ((anonymous_namespace)::levelMode < 3) {
              std::__cxx11::string::assign((char *)&local_238);
            }
            psVar35 = psVar35 + 1;
          }
          poVar16 = std::operator<<((ostream *)&std::cout,"part 1: type ");
          poVar16 = std::operator<<(poVar16,(string *)typeNames);
          poVar16 = std::operator<<(poVar16," tiled part, ");
          poVar16 = std::operator<<(poVar16,"part 2: type ");
          poVar16 = std::operator<<(poVar16,(string *)(typeNames + 1));
          poVar16 = std::operator<<(poVar16," tiled part, ");
          poVar16 = std::operator<<(poVar16,"level mode ");
          poVar16 = std::operator<<(poVar16,(string *)&local_238);
          poVar16 = std::operator<<(poVar16," tile size ");
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(anonymous_namespace)::tileSize);
          poVar16 = std::operator<<(poVar16,"x");
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(anonymous_namespace)::tileSize);
          std::endl<char,std::char_traits<char>>(poVar16);
          std::ostream::flush();
          std::operator<<((ostream *)&std::cout,"Generating headers ");
          std::ostream::flush();
          std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::clear
                    ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                     &(anonymous_namespace)::headers);
          piVar43 = &(anonymous_namespace)::pixelTypes;
          for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
            _ss = 0;
            Imf_3_2::Header::Header
                      (&header,0xc5,0x107,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
            iVar9 = *piVar43;
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::ostream::operator<<(local_1a8,(int)lVar17);
            std::__cxx11::stringbuf::str();
            Imf_3_2::Header::setName((string *)&header);
            std::__cxx11::string::~string((string *)halfData);
            if (iVar9 == 0) {
              pcVar18 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)halfData,UINT,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar18,(Channel *)"UINT");
            }
            else if (iVar9 == 1) {
              pcVar18 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)halfData,FLOAT,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar18,(Channel *)"FLOAT");
            }
            else if (iVar9 == 2) {
              pcVar18 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)halfData,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar18,(Channel *)"HALF");
            }
            Imf_3_2::Header::setType((string *)&header);
            uVar11 = (anonymous_namespace)::levelMode;
            if (2 < (anonymous_namespace)::levelMode) {
              uVar11 = 3;
            }
            halfData[0]._sizeX =
                 CONCAT44((anonymous_namespace)::tileSize,(anonymous_namespace)::tileSize);
            halfData[0]._sizeY = (long)uVar11;
            Imf_3_2::Header::setTileDescription((TileDescription *)&header);
            std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                      ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                       &(anonymous_namespace)::headers,(value_type *)&header);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            Imf_3_2::Header::~Header(&header);
            piVar43 = piVar43 + 1;
          }
          remove(fn._M_dataplus._M_p);
          _Var4 = fn._M_dataplus;
          lVar17 = DAT_001d9d00;
          pHVar2 = (anonymous_namespace)::headers;
          iVar9 = Imf_3_2::globalThreadCount();
          Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                    (&file,_Var4._M_p,pHVar2,(int)((lVar17 - (long)pHVar2) / 0x38),false,iVar9);
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
            Imf_3_2::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&ss,&file,iVar9);
            std::vector<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>::
            push_back(&parts,(TiledOutputPart *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Writing files ");
          std::ostream::flush();
          pTVar3 = parts.
                   super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = Imf_3_2::TiledOutputPart::numXLevels();
          iVar10 = Imf_3_2::TiledOutputPart::numYLevels();
          iVar38 = 0;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          for (; iVar38 != iVar9; iVar38 = iVar38 + 1) {
            for (iVar32 = 0; iVar32 != iVar10; iVar32 = iVar32 + 1) {
              iVar14 = (int)pTVar3;
              cVar5 = Imf_3_2::TiledOutputPart::isValidLevel(iVar14,iVar38);
              if (cVar5 != '\0') {
                uVar11 = Imf_3_2::TiledOutputPart::levelWidth(iVar14);
                uVar12 = Imf_3_2::TiledOutputPart::levelHeight(iVar14);
                lVar17 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar17) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar17) = 0;
                  *(long *)((long)local_1a8 + lVar17 + 8) = (long)local_1b0 + lVar17;
                  *(long *)((long)local_1a8 + lVar17 + 0x10) = (long)local_1b0 + lVar17;
                  *(undefined8 *)((long)local_1a8 + lVar17 + 0x18) = 0;
                  lVar17 = lVar17 + 0x30;
                } while (lVar17 != 0x60);
                lVar17 = (long)(int)uVar12;
                lVar31 = (long)(int)uVar11;
                uVar45 = 0;
                if (0 < (int)uVar11) {
                  uVar45 = (ulong)uVar11;
                }
                uVar36 = 0;
                if (0 < (int)uVar12) {
                  uVar36 = (ulong)uVar12;
                }
                for (lVar34 = 0; lVar34 != 2; lVar34 = lVar34 + 1) {
                  iVar13 = (&(anonymous_namespace)::pixelTypes)[lVar34];
                  if (iVar13 == 2) {
                    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(halfData + lVar34,lVar17,lVar31);
                    iVar13 = 0;
                    lVar39 = 0;
                    for (uVar41 = 0; uVar41 != uVar36; uVar41 = uVar41 + 1) {
                      iVar37 = iVar13;
                      for (uVar42 = 0; (uint)((int)uVar45 * 2) != uVar42; uVar42 = uVar42 + 2) {
                        Imath_3_2::half::operator=
                                  ((half *)((long)&(halfData[lVar34]._data)->_h +
                                           uVar42 + halfData[lVar34]._sizeY * lVar39),
                                   (float)(iVar37 % 0x801));
                        iVar37 = iVar37 + 1;
                      }
                      lVar39 = lVar39 + 2;
                      iVar13 = iVar13 + uVar11;
                    }
LAB_001770af:
                    iVar13 = (&(anonymous_namespace)::pixelTypes)[lVar34];
                  }
                  else {
                    if (iVar13 == 1) {
                      Imf_3_2::Array2D<float>::resizeErase(floatData + lVar34,lVar17,lVar31);
                      iVar13 = 0;
                      lVar39 = 0;
                      for (uVar41 = 0; uVar41 != uVar36; uVar41 = uVar41 + 1) {
                        lVar44 = floatData[lVar34]._sizeY;
                        pfVar23 = floatData[lVar34]._data;
                        for (uVar42 = 0; uVar45 != uVar42; uVar42 = uVar42 + 1) {
                          *(float *)((long)pfVar23 + uVar42 * 4 + lVar44 * lVar39) =
                               (float)((iVar13 + (int)uVar42) % 0x801);
                        }
                        lVar39 = lVar39 + 4;
                        iVar13 = iVar13 + uVar11;
                      }
                      goto LAB_001770af;
                    }
                    if (iVar13 == 0) {
                      Imf_3_2::Array2D<unsigned_int>::resizeErase(uintData + lVar34,lVar17,lVar31);
                      iVar13 = 0;
                      lVar39 = 0;
                      for (uVar41 = 0; uVar41 != uVar36; uVar41 = uVar41 + 1) {
                        lVar44 = uintData[lVar34]._sizeY;
                        puVar1 = uintData[lVar34]._data;
                        for (uVar42 = 0; uVar45 != uVar42; uVar42 = uVar42 + 1) {
                          *(int *)((long)puVar1 + uVar42 * 4 + lVar44 * lVar39) =
                               (iVar13 + (int)uVar42) % 0x801;
                        }
                        lVar39 = lVar39 + 4;
                        iVar13 = iVar13 + uVar11;
                      }
                      goto LAB_001770af;
                    }
                  }
                  psVar46 = &ss + lVar34 * 0x30;
                  if (iVar13 == 2) {
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,HALF,(char *)halfData[lVar34]._data,2,lVar31 * 2,1,1
                               ,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"HALF");
                  }
                  else if (iVar13 == 1) {
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,FLOAT,(char *)floatData[lVar34]._data,4,lVar31 * 4,1
                               ,1,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"FLOAT");
                  }
                  else if (iVar13 == 0) {
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,UINT,(char *)uintData[lVar34]._data,4,lVar31 * 4,1,1
                               ,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"UINT");
                  }
                  Imf_3_2::TiledOutputPart::setFrameBuffer
                            ((FrameBuffer *)
                             (parts.
                              super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar34 * 8));
                }
                IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar19 = (ThreadPool *)operator_new(0x10);
                IlmThread_3_2::ThreadPool::ThreadPool(pTVar19,2);
                iVar13 = Imf_3_2::TiledOutputPart::numXTiles(iVar14);
                iVar14 = Imf_3_2::TiledOutputPart::numYTiles(iVar14);
                iVar37 = 0;
                if (iVar14 < 1) {
                  iVar14 = iVar37;
                }
                for (; iVar14 != iVar37; iVar37 = iVar37 + 1) {
                  pWVar20 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1fa057::WritingTask::WritingTask
                            (pWVar20,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar38,iVar32,iVar37,iVar13);
                  IlmThread_3_2::ThreadPool::addTask((Task *)pTVar19);
                  pWVar20 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1fa057::WritingTask::WritingTask
                            (pWVar20,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8,iVar38,iVar32,iVar37,
                             iVar13);
                  IlmThread_3_2::ThreadPool::addTask((Task *)pTVar19);
                }
                (**(code **)(*(long *)pTVar19 + 8))(pTVar19);
                IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar17 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)(&ss + lVar17));
                  lVar17 = lVar17 + -0x30;
                } while (lVar17 != -0x30);
              }
            }
          }
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&uintData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)((long)&halfData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          std::_Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>::
          ~_Vector_base(&parts.
                         super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                       );
          Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&file);
          std::operator<<((ostream *)&std::cout,"Checking headers ");
          std::ostream::flush();
          _Var4 = fn._M_dataplus;
          iVar9 = Imf_3_2::globalThreadCount();
          Imf_3_2::MultiPartInputFile::MultiPartInputFile
                    ((MultiPartInputFile *)&file,_Var4._M_p,iVar9,true);
          iVar9 = Imf_3_2::MultiPartInputFile::parts();
          if (iVar9 != 2) {
            __assert_fail("file.parts () == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                          ,0x176,"void (anonymous namespace)::readFiles(const std::string &)");
          }
          lVar17 = 0;
          while (lVar17 != 2) {
            Imf_3_2::MultiPartInputFile::header((int)&file);
            pBVar21 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
            pBVar22 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
            bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar21,pBVar22);
            if (!bVar6) {
              __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17a,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pBVar21 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
            pBVar22 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
            bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar21,pBVar22);
            if (!bVar6) {
              __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17b,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
            fVar47 = *pfVar23;
            pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
            if ((fVar47 != *pfVar23) || (NAN(fVar47) || NAN(*pfVar23))) {
              __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17c,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar23 = (float *)Imf_3_2::Header::screenWindowCenter();
            pfVar24 = (float *)Imf_3_2::Header::screenWindowCenter();
            if ((((*pfVar23 != *pfVar24) || (NAN(*pfVar23) || NAN(*pfVar24))) ||
                (pfVar23[1] != pfVar24[1])) || (NAN(pfVar23[1]) || NAN(pfVar24[1]))) {
              __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17e,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
            fVar47 = *pfVar23;
            pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
            if ((fVar47 != *pfVar23) || (NAN(fVar47) || NAN(*pfVar23))) {
              __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x17f,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            piVar43 = (int *)Imf_3_2::Header::lineOrder();
            iVar9 = *piVar43;
            piVar43 = (int *)Imf_3_2::Header::lineOrder();
            if (iVar9 != *piVar43) {
              __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x180,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            piVar43 = (int *)Imf_3_2::Header::compression();
            iVar9 = *piVar43;
            piVar43 = (int *)Imf_3_2::Header::compression();
            if (iVar9 != *piVar43) {
              __assert_fail("header.compression () == headers[i].compression ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x181,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            this = (ChannelList *)Imf_3_2::Header::channels();
            pCVar25 = (ChannelList *)Imf_3_2::Header::channels();
            cVar5 = Imf_3_2::ChannelList::operator==(this,pCVar25);
            if (cVar5 == '\0') {
              __assert_fail("header.channels () == headers[i].channels ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x182,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_2::Header::name_abi_cxx11_();
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_2::Header::name_abi_cxx11_();
            _Var7 = std::operator==(pbVar26,pbVar27);
            if (!_Var7) {
              __assert_fail("header.name () == headers[i].name ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x183,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_2::Header::type_abi_cxx11_();
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Imf_3_2::Header::type_abi_cxx11_();
            _Var7 = std::operator==(pbVar26,pbVar27);
            lVar17 = lVar17 + 1;
            if (!_Var7) {
              __assert_fail("header.type () == headers[i].type ()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                            ,0x184,"void (anonymous namespace)::readFiles(const std::string &)");
            }
          }
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          parts.
          super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
            Imf_3_2::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&ss,(MultiPartInputFile *)&file,iVar9);
            std::vector<Imf_3_2::TiledInputPart,_std::allocator<Imf_3_2::TiledInputPart>_>::
            push_back((vector<Imf_3_2::TiledInputPart,_std::allocator<Imf_3_2::TiledInputPart>_> *)
                      &parts,(TiledInputPart *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Reading and comparing files ");
          std::ostream::flush();
          pTVar3 = parts.
                   super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = Imf_3_2::TiledInputPart::numXLevels();
          iVar10 = Imf_3_2::TiledInputPart::numYLevels();
          iVar38 = 0;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          for (; iVar38 != iVar9; iVar38 = iVar38 + 1) {
            for (iVar32 = 0; psVar46 = &ss, iVar32 != iVar10; iVar32 = iVar32 + 1) {
              iVar14 = (int)pTVar3;
              cVar5 = Imf_3_2::TiledInputPart::isValidLevel(iVar14,iVar38);
              if (cVar5 != '\0') {
                iVar13 = Imf_3_2::TiledInputPart::levelWidth(iVar14);
                uVar11 = Imf_3_2::TiledInputPart::levelHeight(iVar14);
                lVar17 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar17) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar17) = 0;
                  *(long *)((long)local_1a8 + lVar17 + 8) = (long)local_1b0 + lVar17;
                  *(long *)((long)local_1a8 + lVar17 + 0x10) = (long)local_1b0 + lVar17;
                  *(undefined8 *)((long)local_1a8 + lVar17 + 0x18) = 0;
                  lVar17 = lVar17 + 0x30;
                } while (lVar17 != 0x60);
                lVar39 = (long)(int)uVar11;
                lVar34 = (long)iVar13;
                piVar43 = &(anonymous_namespace)::pixelTypes;
                lVar31 = 0;
                for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 0x18) {
                  iVar37 = *piVar43;
                  if (iVar37 == 2) {
                    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
                              ((Array2D<Imath_3_2::half> *)((long)&uintData[0]._sizeX + lVar17),
                               lVar39,lVar34);
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,HALF,*(char **)((long)&uintData[0]._data + lVar17),2
                               ,lVar34 * 2,1,1,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"HALF");
                  }
                  else if (iVar37 == 1) {
                    Imf_3_2::Array2D<float>::resizeErase
                              ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar17),lVar39,lVar34
                              );
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,FLOAT,*(char **)((long)&floatData[0]._data + lVar17)
                               ,4,lVar34 * 4,1,1,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"FLOAT");
                  }
                  else if (iVar37 == 0) {
                    Imf_3_2::Array2D<unsigned_int>::resizeErase
                              ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar17),lVar39,
                               lVar34);
                    Imf_3_2::Slice::Slice
                              ((Slice *)&header,UINT,*(char **)((long)&halfData[0]._data + lVar17),4
                               ,lVar34 * 4,1,1,0.0,false,false);
                    Imf_3_2::FrameBuffer::insert((char *)psVar46,(Slice *)"UINT");
                  }
                  Imf_3_2::TiledInputPart::setFrameBuffer
                            ((FrameBuffer *)
                             (parts.
                              super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar31));
                  lVar31 = lVar31 + 8;
                  piVar43 = piVar43 + 1;
                  psVar46 = psVar46 + 0x30;
                }
                IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar19 = (ThreadPool *)operator_new(0x10);
                IlmThread_3_2::ThreadPool::ThreadPool(pTVar19,2);
                iVar37 = Imf_3_2::TiledInputPart::numXTiles(iVar14);
                iVar14 = Imf_3_2::TiledInputPart::numYTiles(iVar14);
                startY = 0;
                if (iVar14 < 1) {
                  iVar14 = startY;
                }
                for (; iVar14 != startY; startY = startY + 1) {
                  pRVar28 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1fa057::ReadingTask::ReadingTask
                            (pRVar28,(TaskGroup *)&header,
                             (TiledInputPart *)
                             parts.
                             super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar38,iVar32,startY,iVar37);
                  IlmThread_3_2::ThreadPool::addTask((Task *)pTVar19);
                  pRVar28 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1fa057::ReadingTask::ReadingTask
                            (pRVar28,(TaskGroup *)&header,
                             (TiledInputPart *)
                             (parts.
                              super__Vector_base<Imf_3_2::TiledOutputPart,_std::allocator<Imf_3_2::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8),iVar38,iVar32,startY,
                             iVar37);
                  IlmThread_3_2::ThreadPool::addTask((Task *)pTVar19);
                }
                (**(code **)(*(long *)pTVar19 + 8))();
                iVar14 = iVar13 + -1;
                if (iVar13 + -1 < 0) {
                  iVar14 = -1;
                }
                lVar17 = (long)iVar14 + 1;
                uVar45 = 0;
                if (0 < (int)uVar11) {
                  uVar45 = (ulong)uVar11;
                }
                lVar31 = (long)(int)(uVar11 - 1);
                for (lVar34 = 0; lVar34 != 2; lVar34 = lVar34 + 1) {
                  iVar14 = (&(anonymous_namespace)::pixelTypes)[lVar34];
                  if (iVar14 == 2) {
                    iVar14 = 0;
                    local_388 = 0;
                    for (uVar36 = 0; local_3c0 = uVar45, uVar36 != uVar45; uVar36 = uVar36 + 1) {
                      for (lVar39 = 0; lVar17 != lVar39; lVar39 = lVar39 + 1) {
                        fVar47 = *(float *)(_imath_half_to_float_table +
                                           (ulong)*(ushort *)
                                                   ((long)uintData[lVar34]._data +
                                                   lVar39 * 2 + uintData[lVar34]._sizeY * local_388)
                                           * 4);
                        iVar37 = ((int)lVar39 + iVar14) % 0x801;
                        Imath_3_2::half::half(&local_37a,(float)iVar37);
                        pfVar23 = (float *)(_imath_half_to_float_table + (ulong)local_37a._h * 4);
                        if ((fVar47 != *pfVar23) || (NAN(fVar47) || NAN(*pfVar23))) {
                          poVar16 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar39);
                          poVar16 = std::operator<<(poVar16,", ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)uVar36);
                          poVar16 = std::operator<<(poVar16,": ");
                          poVar16 = (ostream *)
                                    operator<<(poVar16,(half)*(uint16_t *)
                                                              ((long)uintData[lVar34]._data +
                                                              lVar39 * 2 +
                                                              local_388 * uintData[lVar34]._sizeY));
                          poVar16 = std::operator<<(poVar16,", should be ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                          std::endl<char,std::char_traits<char>>(poVar16);
                          std::ostream::flush();
                          local_3c0 = uVar36;
                          goto LAB_00177d18;
                        }
                      }
                      local_388 = local_388 + 2;
                      iVar14 = iVar14 + iVar13;
                    }
LAB_00177d18:
                    if ((long)local_3c0 <= lVar31) {
                      __assert_fail("checkPixels<half> (hData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1cd,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar14 == 1) {
                    pfVar23 = floatData[lVar34]._data;
                    iVar14 = 0;
                    lVar39 = 0;
                    for (uVar36 = 0; uVar41 = uVar45, uVar36 != uVar45; uVar36 = uVar36 + 1) {
                      for (lVar44 = 0; lVar17 != lVar44; lVar44 = lVar44 + 1) {
                        iVar37 = (iVar14 + (int)lVar44) % 0x801;
                        fVar47 = (float)iVar37;
                        if ((pfVar23[lVar44] != fVar47) || (NAN(pfVar23[lVar44]) || NAN(fVar47))) {
                          poVar16 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar44);
                          poVar16 = std::operator<<(poVar16,", ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)uVar36);
                          poVar16 = std::operator<<(poVar16,": ");
                          poVar16 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar16,*(float *)((long)floatData[lVar34]._data +
                                                                 lVar44 * 4 +
                                                                 lVar39 * floatData[lVar34]._sizeY))
                          ;
                          poVar16 = std::operator<<(poVar16,", should be ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                          std::endl<char,std::char_traits<char>>(poVar16);
                          std::ostream::flush();
                          uVar41 = uVar36;
                          goto LAB_00177c72;
                        }
                      }
                      lVar39 = lVar39 + 4;
                      iVar14 = iVar14 + iVar13;
                      pfVar23 = pfVar23 + floatData[lVar34]._sizeY;
                    }
LAB_00177c72:
                    if ((long)uVar41 <= lVar31) {
                      __assert_fail("checkPixels<float> (fData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1cc,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar14 == 0) {
                    phVar40 = halfData[lVar34]._data;
                    iVar14 = 0;
                    for (uVar36 = 0; uVar41 = uVar45, uVar36 != uVar45; uVar36 = uVar36 + 1) {
                      for (lVar39 = 0; lVar17 != lVar39; lVar39 = lVar39 + 1) {
                        iVar37 = (iVar14 + (int)lVar39) % 0x801;
                        if (*(int *)(phVar40 + lVar39 * 2) != iVar37) {
                          poVar16 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)lVar39);
                          poVar16 = std::operator<<(poVar16,", ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,(int)uVar36);
                          poVar16 = std::operator<<(poVar16,": ");
                          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                          poVar16 = std::operator<<(poVar16,", should be ");
                          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar37);
                          std::endl<char,std::char_traits<char>>(poVar16);
                          std::ostream::flush();
                          uVar41 = uVar36;
                          goto LAB_00177dbb;
                        }
                      }
                      iVar14 = iVar14 + iVar13;
                      phVar40 = phVar40 + halfData[lVar34]._sizeY * 2;
                    }
LAB_00177dbb:
                    if ((long)uVar41 <= lVar31) {
                      __assert_fail("checkPixels<unsigned int> (uData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                    ,0x1ca,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                }
                IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar17 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)(&ss + lVar17));
                  lVar17 = lVar17 + -0x30;
                } while (lVar17 != -0x30);
              }
            }
          }
          std::_Vector_base<Imf_3_2::TiledInputPart,_std::allocator<Imf_3_2::TiledInputPart>_>::
          ~_Vector_base((_Vector_base<Imf_3_2::TiledInputPart,_std::allocator<Imf_3_2::TiledInputPart>_>
                         *)&parts);
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)((long)&uintData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          lVar17 = 0x18;
          do {
            Imf_3_2::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar17));
            lVar17 = lVar17 + -0x18;
          } while (lVar17 != -0x18);
          Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&file);
          remove(fn._M_dataplus._M_p);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::ostream::flush();
          std::__cxx11::string::~string((string *)&local_238);
          lVar17 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&typeNames[0]._M_dataplus._M_p + lVar17))
            ;
            lVar17 = lVar17 + -0x20;
          } while (lVar17 != -0x20);
          std::__cxx11::string::~string((string *)&fn);
          uVar15 = uVar15 + 0x32;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void
testMultiTiledPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the two threads reading/writing on two-tiled-part file"
             << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        for (int pt1 = 0; pt1 < 3; pt1++)
            for (int pt2 = 0; pt2 < 3; pt2++)
                for (int lm = 0; lm < 3; lm++)
                    for (int size = 1; size < min (width, height); size += 50)
                    {
                        pixelTypes[0] = pt1;
                        pixelTypes[1] = pt2;
                        levelMode     = lm;
                        tileSize      = size;
                        testWriteRead (tempDir);
                    }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}